

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.c
# Opt level: O2

void validate_tour(Instance *instance,Tour *tour,int32_t min_num_customers_served)

{
  int iVar1;
  uint uVar2;
  int32_t *piVar3;
  void *pvVar4;
  uint *puVar5;
  ulong uVar6;
  char *__assertion;
  int iVar7;
  int32_t first_vertex;
  uint uVar8;
  ulong uVar9;
  int32_t i;
  int iVar10;
  double local_48;
  
  if (tour->num_comps == 1) {
    iVar1 = tour->num_customers;
    iVar10 = 0;
    piVar3 = tcomp(tour,0);
    if (*piVar3 == 0) {
      do {
        if (iVar1 < iVar10) {
          iVar10 = 0;
          goto LAB_00107ee1;
        }
        piVar3 = tcomp(tour,iVar10);
        iVar10 = iVar10 + 1;
      } while (*piVar3 < 1);
      __assertion = "c == 0 || c < 0";
      uVar8 = 0x57;
    }
    else {
      __assertion = "*tcomp(tour, 0) == 0";
      uVar8 = 0x51;
    }
  }
  else {
    __assertion = "tour->num_comps == 1";
    uVar8 = 0x4a;
  }
  goto LAB_00108149;
LAB_00107ee1:
  if (iVar1 < iVar10) goto LAB_00107f22;
  piVar3 = tcomp(tour,iVar10);
  if ((-1 < *piVar3) &&
     ((piVar3 = tsucc(tour,iVar10), *piVar3 < 0 || (piVar3 = tsucc(tour,iVar10), iVar1 < *piVar3))))
  {
    __assertion = "*tsucc(tour, i) >= 0 && *tsucc(tour, i) < n";
    uVar8 = 0x5f;
    goto LAB_00108149;
  }
  iVar10 = iVar10 + 1;
  goto LAB_00107ee1;
LAB_00107f22:
  pvVar4 = calloc((long)(iVar1 + 1),1);
  piVar3 = tcomp(tour,0);
  if (*piVar3 < 0) {
    iVar10 = -1;
LAB_00107fc3:
    free(pvVar4);
    if (min_num_customers_served <= iVar10) {
      pvVar4 = calloc((long)(iVar1 + 1),1);
      uVar9 = 0;
      iVar10 = 0;
      do {
        if ((long)iVar1 < (long)uVar9) {
          if (iVar10 != tour->num_comps) {
            __assert_fail("num_comps == tour->num_comps",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/validation.c"
                          ,0xa3,"void validate_tour(const Instance *, Tour *, int32_t)");
          }
          free(pvVar4);
          piVar3 = tcomp(tour,0);
          if (*piVar3 < 0) {
            local_48 = 0.0;
          }
          else {
            local_48 = *instance->demands + 0.0;
            uVar8 = 0;
            while( true ) {
              puVar5 = (uint *)tsucc(tour,uVar8);
              uVar2 = *puVar5;
              if ((ulong)uVar2 == 0) break;
              if ((int)uVar2 < 0) {
                __assert_fail("next_vertex >= 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/core-utils.h"
                              ,0x98,"double tour_demand(const Instance *, Tour *)");
              }
              if (uVar2 == uVar8) {
                __assert_fail("next_vertex != curr_vertex",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/core-utils.h"
                              ,0x99,"double tour_demand(const Instance *, Tour *)");
              }
              local_48 = local_48 + instance->demands[uVar2];
              uVar8 = uVar2;
            }
          }
          if ((instance->vehicle_cap <= local_48) && (1e-05 < ABS(local_48 - instance->vehicle_cap))
             ) {
            __assert_fail("flte(tour_demand(instance, tour), instance->vehicle_cap, 1e-5)",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/validation.c"
                          ,0xaa,"void validate_tour(const Instance *, Tour *, int32_t)");
          }
          return;
        }
        if (*(char *)((long)pvVar4 + uVar9) == '\0') {
          *(undefined1 *)((long)pvVar4 + uVar9) = 1;
          uVar6 = uVar9 & 0xffffffff;
          iVar7 = iVar1 + 2;
          do {
            iVar7 = iVar7 + -1;
            if (iVar7 == 0) goto LAB_00107ffc;
            piVar3 = tsucc(tour,(int32_t)uVar6);
            uVar6 = (ulong)*piVar3;
            if ((long)uVar6 < 0) goto LAB_00107ffc;
            *(undefined1 *)((long)pvVar4 + uVar6) = 1;
          } while (uVar9 != uVar6);
          iVar10 = iVar10 + 1;
        }
LAB_00107ffc:
        uVar9 = uVar9 + 1;
      } while( true );
    }
    __assertion = "num_visited - 1 >= (min_num_customers_served)";
    uVar8 = 0x7f;
  }
  else {
    piVar3 = tsucc(tour,0);
    if (-1 < *piVar3) {
      iVar10 = 0;
      piVar3 = tcomp(tour,0);
      if (-1 < *piVar3) {
        uVar8 = 0;
        while( true ) {
          puVar5 = (uint *)tsucc(tour,uVar8);
          uVar2 = *puVar5;
          uVar9 = (ulong)uVar2;
          if (uVar9 == 0) break;
          if (uVar2 == uVar8) {
            __assertion = "next_vertex != curr_vertex";
            uVar8 = 0x75;
            goto LAB_00108149;
          }
          if (((int)uVar2 < 0) || (iVar1 < (int)uVar2)) {
            __assertion = "next_vertex >= 0 && next_vertex < n";
            uVar8 = 0x76;
            goto LAB_00108149;
          }
          if (*(char *)((long)pvVar4 + uVar9) != '\0') {
            __assertion = "visited[next_vertex] == false";
            uVar8 = 0x77;
            goto LAB_00108149;
          }
          *(undefined1 *)((long)pvVar4 + uVar9) = 1;
          iVar10 = iVar10 + 1;
          uVar8 = uVar2;
        }
        goto LAB_00107fc3;
      }
    }
    __assertion = "*tsucc(tour, 0) >= 0 && *tcomp(tour, 0) >= 0";
    uVar8 = 0x6d;
  }
LAB_00108149:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/validation.c"
                ,uVar8,"void validate_tour(const Instance *, Tour *, int32_t)");
}

Assistant:

void validate_tour(const Instance *instance, Tour *tour,
                   int32_t min_num_customers_served) {
#ifndef NDEBUG
    int32_t n = tour->num_customers + 1;

    //
    // There should be only one subtour
    //
    assert(tour->num_comps == 1);

    //
    // The same subtour should share the same component idx
    //
    {
        // Depot is always part of the tour
        assert(*tcomp(tour, 0) == 0);

        // Check that each vertex is either part of the first and only tour
        // or otherwise it is not visited
        for (int32_t i = 0; i < n; i++) {
            int32_t c = *tcomp(tour, i);
            assert(c == 0 || c < 0);
        }

        // Check that each vertex if is part of a component index it has its
        // succ populated
        for (int32_t i = 0; i < n; i++) {
            int32_t c = *tcomp(tour, i);
            if (c >= 0) {
                assert(*tsucc(tour, i) >= 0 && *tsucc(tour, i) < n);
            }
        }
    }

    //
    // Validate succ array consistency:
    //       - Assert succ is within range
    //       - Vertices cannot be visited twice
    //
    {
        int32_t num_visited = 0;
        bool *visited = calloc(n, sizeof(*visited));
        if (*tcomp(tour, 0) >= 0) {
            assert(*tsucc(tour, 0) >= 0 && *tcomp(tour, 0) >= 0);
            visited[0] = true;
            ++num_visited;

            int32_t curr_vertex = 0;
            int32_t next_vertex;

            while ((next_vertex = *tsucc(tour, curr_vertex)) != 0) {
                assert(next_vertex != curr_vertex);
                assert(next_vertex >= 0 && next_vertex < n);
                assert(visited[next_vertex] == false);
                visited[next_vertex] = true;
                ++num_visited;
                curr_vertex = next_vertex;
            }
        }
        free(visited);

        assert(num_visited - 1 >= (min_num_customers_served));
    }

    //
    // Verify that the number of components that the tour reports
    // is actually consistent with what is encoded in the succ array
    //
    {

        bool *visited = calloc(n, sizeof(*visited));
        int32_t num_comps = 0;
        for (int32_t i = 0; i < n; i++) {
            if (visited[i] == false) {
                int32_t first_vertex = i;
                int32_t curr_vertex = first_vertex;

                visited[first_vertex] = true;

                for (int32_t retries = 0; retries < n; retries++) {
                    int32_t next_vertex = *tsucc(tour, curr_vertex);
                    if (next_vertex < 0) {
                        break;
                    }

                    visited[next_vertex] = true;

                    if (next_vertex == first_vertex) {
                        num_comps++;
                        break;
                    }

                    curr_vertex = next_vertex;
                }
            }
        }

        assert(num_comps == tour->num_comps);
        free(visited);
    }

    //
    // Validate capacity is not exceeded
    //
    assert(flte(tour_demand(instance, tour), instance->vehicle_cap, 1e-5));

#else
    UNUSED_PARAM(instance);
    UNUSED_PARAM(tour);
#endif
}